

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_sse2.c
# Opt level: O1

void cfl_subtract_average_4x4_sse2(uint16_t *src,int16_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  int iVar13;
  ushort uVar15;
  int iVar14;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  
  uVar1 = *(undefined8 *)(src + 0x20);
  uVar2 = *(undefined8 *)src;
  uVar15 = (short)((ulong)uVar2 >> 0x30) + (short)((ulong)uVar1 >> 0x30);
  auVar5._12_2_ = uVar15;
  auVar5._0_12_ = ZEXT212(uVar15) << 0x30;
  uVar9 = CONCAT44(auVar5._10_4_,
                   CONCAT22((short)((ulong)uVar2 >> 0x20) + (short)((ulong)uVar1 >> 0x20),uVar15));
  auVar7._6_8_ = 0;
  auVar7._0_6_ = (uint6)((ulong)uVar9 >> 0x10);
  uVar3 = *(undefined8 *)(src + 0x60);
  uVar4 = *(undefined8 *)(src + 0x40);
  uVar15 = (short)((ulong)uVar4 >> 0x30) + (short)((ulong)uVar3 >> 0x30);
  auVar6._12_2_ = uVar15;
  auVar6._0_12_ = ZEXT212(uVar15) << 0x30;
  uVar10 = CONCAT44(auVar6._10_4_,
                    CONCAT22((short)((ulong)uVar4 >> 0x20) + (short)((ulong)uVar3 >> 0x20),uVar15));
  auVar8._6_8_ = 0;
  auVar8._0_6_ = (uint6)((ulong)uVar10 >> 0x10);
  iVar16 = (uint)(ushort)((short)uVar4 + (short)uVar3) + (uint)(ushort)((short)uVar2 + (short)uVar1)
  ;
  iVar17 = (int)CONCAT82(SUB148(auVar8 << 0x40,6),
                         (short)((ulong)uVar4 >> 0x10) + (short)((ulong)uVar3 >> 0x10)) +
           (int)CONCAT82(SUB148(auVar7 << 0x40,6),
                         (short)((ulong)uVar2 >> 0x10) + (short)((ulong)uVar1 >> 0x10));
  iVar18 = (int)((ulong)uVar10 >> 0x10) + (int)((ulong)uVar9 >> 0x10);
  iVar19 = (auVar6._10_4_ >> 0x10) + (auVar5._10_4_ >> 0x10);
  iVar13 = iVar18 + iVar16;
  iVar14 = iVar19 + iVar17;
  iVar16 = iVar16 + iVar18;
  iVar17 = iVar17 + iVar19;
  auVar12._0_4_ = iVar14 + iVar13 + 8U >> 4;
  auVar12._4_4_ = iVar13 + iVar14 + 8U >> 4;
  auVar12._8_4_ = iVar17 + iVar16 + 8U >> 4;
  auVar12._12_4_ = iVar16 + iVar17 + 8U >> 4;
  auVar12 = packssdw(auVar12,auVar12);
  uVar11 = 0xffffffffffffffc0;
  do {
    uVar1 = *(undefined8 *)((long)src + uVar11 + 0x40);
    *(ulong *)((long)dst + uVar11 + 0x40) =
         CONCAT26((short)((ulong)uVar1 >> 0x30) - auVar12._6_2_,
                  CONCAT24((short)((ulong)uVar1 >> 0x20) - auVar12._4_2_,
                           CONCAT22((short)((ulong)uVar1 >> 0x10) - auVar12._2_2_,
                                    (short)uVar1 - auVar12._0_2_)));
    uVar11 = uVar11 + 0x40;
  } while (uVar11 < 0xc0);
  return;
}

Assistant:

static inline void subtract_average_sse2(const uint16_t *src_ptr,
                                         int16_t *dst_ptr, int width,
                                         int height, int round_offset,
                                         int num_pel_log2) {
  const __m128i zeros = _mm_setzero_si128();
  const __m128i round_offset_epi32 = _mm_set1_epi32(round_offset);
  const __m128i *src = (__m128i *)src_ptr;
  const __m128i *const end = src + height * CFL_BUF_LINE_I128;
  const int step = CFL_BUF_LINE_I128 * (1 + (width == 8) + 3 * (width == 4));

  __m128i sum = zeros;
  do {
    __m128i l0;
    if (width == 4) {
      l0 = _mm_add_epi16(_mm_loadl_epi64(src),
                         _mm_loadl_epi64(src + CFL_BUF_LINE_I128));
      __m128i l1 = _mm_add_epi16(_mm_loadl_epi64(src + 2 * CFL_BUF_LINE_I128),
                                 _mm_loadl_epi64(src + 3 * CFL_BUF_LINE_I128));
      sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                             _mm_unpacklo_epi16(l1, zeros)));
    } else {
      if (width == 8) {
        l0 = _mm_add_epi16(_mm_loadu_si128(src),
                           _mm_loadu_si128(src + CFL_BUF_LINE_I128));
      } else {
        l0 = _mm_add_epi16(_mm_loadu_si128(src), _mm_loadu_si128(src + 1));
      }
      sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                             _mm_unpackhi_epi16(l0, zeros)));
      if (width == 32) {
        l0 = _mm_add_epi16(_mm_loadu_si128(src + 2), _mm_loadu_si128(src + 3));
        sum = _mm_add_epi32(sum, _mm_add_epi32(_mm_unpacklo_epi16(l0, zeros),
                                               _mm_unpackhi_epi16(l0, zeros)));
      }
    }
    src += step;
  } while (src < end);

  sum = fill_sum_epi32(sum);

  __m128i avg_epi16 =
      _mm_srli_epi32(_mm_add_epi32(sum, round_offset_epi32), num_pel_log2);
  avg_epi16 = _mm_packs_epi32(avg_epi16, avg_epi16);

  src = (__m128i *)src_ptr;
  __m128i *dst = (__m128i *)dst_ptr;
  do {
    if (width == 4) {
      _mm_storel_epi64(dst, _mm_sub_epi16(_mm_loadl_epi64(src), avg_epi16));
    } else {
      _mm_storeu_si128(dst, _mm_sub_epi16(_mm_loadu_si128(src), avg_epi16));
      if (width > 8) {
        _mm_storeu_si128(dst + 1,
                         _mm_sub_epi16(_mm_loadu_si128(src + 1), avg_epi16));
        if (width == 32) {
          _mm_storeu_si128(dst + 2,
                           _mm_sub_epi16(_mm_loadu_si128(src + 2), avg_epi16));
          _mm_storeu_si128(dst + 3,
                           _mm_sub_epi16(_mm_loadu_si128(src + 3), avg_epi16));
        }
      }
    }
    src += CFL_BUF_LINE_I128;
    dst += CFL_BUF_LINE_I128;
  } while (src < end);
}